

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall QGraphicsScene::helpEvent(QGraphicsScene *this,QGraphicsSceneHelpEvent *helpEvent)

{
  QGraphicsScenePrivate *this_00;
  qsizetype qVar1;
  QGraphicsItem **ppQVar2;
  int iVar3;
  QWidget *pQVar4;
  long lVar5;
  long lVar6;
  QGraphicsItem *item;
  long in_FS_OFFSET;
  QPointF QVar7;
  QArrayDataPointer<char16_t> local_98;
  QPoint local_80;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScenePrivate **)(this + 8);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)QGraphicsSceneHelpEvent::screenPos(helpEvent);
  QVar7 = QGraphicsSceneHelpEvent::scenePos(helpEvent);
  local_78.d = (Data *)QVar7.xp;
  local_78.ptr = (char16_t *)QVar7.yp;
  pQVar4 = QGraphicsSceneEvent::widget(&helpEvent->super_QGraphicsSceneEvent);
  QGraphicsScenePrivate::itemsAtPosition
            ((QList<QGraphicsItem_*> *)&local_58,this_00,(QPoint *)&local_98,(QPointF *)&local_78,
             pQVar4);
  ppQVar2 = local_58.ptr;
  lVar5 = local_58.size << 3;
  lVar6 = 0;
  do {
    if (lVar5 == lVar6) {
      item = (QGraphicsItem *)0x0;
      break;
    }
    item = *(QGraphicsItem **)((long)ppQVar2 + lVar6);
    iVar3 = (*((item->d_ptr).d)->_vptr_QGraphicsItemPrivate[7])();
    if (((char)iVar3 != '\0') &&
       (sendEvent(this,item,(QEvent *)helpEvent),
       (helpEvent->super_QGraphicsSceneEvent).field_0xc != '\0')) goto LAB_0059b68e;
    QGraphicsItem::toolTip((QString *)&local_78,item);
    qVar1 = local_78.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    lVar6 = lVar6 + 8;
  } while (qVar1 == 0);
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  local_78.size = 0;
  local_80.xp.m_i = 0;
  local_80.yp.m_i = 0;
  if (item != (QGraphicsItem *)0x0) {
    QGraphicsItem::toolTip((QString *)&local_98,item);
    qVar1 = local_98.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    if (qVar1 != 0) {
      QGraphicsItem::toolTip((QString *)&local_98,item);
      local_78.ptr = local_98.ptr;
      local_78.d = local_98.d;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char16_t *)0x0;
      local_78.size = local_98.size;
      local_98.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      local_80 = QGraphicsSceneHelpEvent::screenPos(helpEvent);
    }
  }
  pQVar4 = QGraphicsSceneEvent::widget(&helpEvent->super_QGraphicsSceneEvent);
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0xffffffffffffffff;
  QToolTip::showText(&local_80,(QString *)&local_78,pQVar4,(QRect *)&local_98,-1);
  (**(code **)(*(long *)&helpEvent->super_QGraphicsSceneEvent + 0x10))(helpEvent,local_78.size != 0)
  ;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
LAB_0059b68e:
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::helpEvent(QGraphicsSceneHelpEvent *helpEvent)
{
#if !QT_CONFIG(tooltip)
    Q_UNUSED(helpEvent);
#else
    // Find the first item that does tooltips
    Q_D(QGraphicsScene);
    const QList<QGraphicsItem *> itemsAtPos = d->itemsAtPosition(helpEvent->screenPos(),
                                                                 helpEvent->scenePos(),
                                                                 helpEvent->widget());
    QGraphicsItem *toolTipItem = nullptr;
    for (auto item : itemsAtPos) {
        if (item->d_func()->isProxyWidget()) {
            // if the item is a proxy widget, the event is forwarded to it
            sendEvent(item, helpEvent);
            if (helpEvent->isAccepted())
                return;
        }
        if (!item->toolTip().isEmpty()) {
            toolTipItem = item;
            break;
        }
    }

    // Show or hide the tooltip
    QString text;
    QPoint point;
    if (toolTipItem && !toolTipItem->toolTip().isEmpty()) {
        text = toolTipItem->toolTip();
        point = helpEvent->screenPos();
    }
    QToolTip::showText(point, text, helpEvent->widget());
    helpEvent->setAccepted(!text.isEmpty());
#endif
}